

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O3

JL_STATUS JlGetObjectFromDictionaryByKey
                    (JlDataObject *DictionaryObject,char *KeyName,JlDataObject **pObject)

{
  JL_DATA_TYPE JVar1;
  JL_STATUS JVar2;
  int iVar3;
  JlDictionaryItem *pJVar4;
  
  JVar2 = JL_STATUS_INVALID_PARAMETER;
  if (pObject != (JlDataObject **)0x0 &&
      (KeyName != (char *)0x0 && DictionaryObject != (JlDataObject *)0x0)) {
    *pObject = (JlDataObject *)0x0;
    JVar1 = DictionaryObject->Type;
    pJVar4 = (JlDictionaryItem *)0x0;
    do {
      if (JVar1 != JL_DATA_TYPE_DICTIONARY) {
        return JL_STATUS_WRONG_TYPE;
      }
      if (pJVar4 == (JlDictionaryItem *)0x0) {
        pJVar4 = (DictionaryObject->field_2).Dictionary.DictionaryHead;
      }
      else {
        if (pJVar4->ParentDictionary != (JlDictionary *)&DictionaryObject->field_2) {
          return JL_STATUS_WRONG_TYPE;
        }
        pJVar4 = pJVar4->Next;
      }
      if (pJVar4 == (JlDictionaryItem *)0x0) {
        return JL_STATUS_NOT_FOUND;
      }
      iVar3 = strcmp(pJVar4->KeyName,KeyName);
    } while (iVar3 != 0);
    *pObject = pJVar4->Object;
    JVar2 = JL_STATUS_SUCCESS;
  }
  return JVar2;
}

Assistant:

JL_STATUS
    JlGetObjectFromDictionaryByKey
    (
        JlDataObject const*         DictionaryObject,
        char const*                 KeyName,
        JlDataObject**              pObject
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;
    JlDictionaryItem* enumerator = NULL;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  NULL != pObject )
    {
        *pObject = NULL;

        while( JL_STATUS_SUCCESS == jlStatus )
        {
            JlDataObject* object = NULL;
            char const* key = NULL;

            jlStatus = JlGetObjectDictionaryNextItem( DictionaryObject, &object, &key, &enumerator );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                if( strcmp( key, KeyName ) == 0 )
                {
                    // Found
                    *pObject = object;
                    break;
                }
            }
        }

        if( JL_STATUS_END_OF_DATA == jlStatus )
        {
            // This means we got to end of dictionary and did not find the key
            jlStatus = JL_STATUS_NOT_FOUND;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}